

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O0

bool sf::VertexBuffer::isAvailable(void)

{
  TransientContextLock contextLock;
  Lock lock;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffe4;
  Mutex *in_stack_ffffffffffffffe8;
  TransientContextLock *in_stack_fffffffffffffff0;
  
  Lock::Lock((Lock *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  if ((isAvailable::checked & 1U) == 0) {
    isAvailable::checked = true;
    GlResource::TransientContextLock::TransientContextLock(in_stack_fffffffffffffff0);
    priv::ensureExtensionsInit();
    isAvailable::available = sfogl_ext_ARB_vertex_buffer_object != 0;
    GlResource::TransientContextLock::~TransientContextLock
              ((TransientContextLock *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
              );
  }
  uVar1 = CONCAT13(isAvailable::available,(int3)in_stack_ffffffffffffffe0);
  Lock::~Lock((Lock *)CONCAT44(in_stack_ffffffffffffffe4,uVar1));
  return (bool)((byte)((uint)uVar1 >> 0x18) & 1);
}

Assistant:

bool VertexBuffer::isAvailable()
{
    Lock lock(isAvailableMutex);

    static bool checked = false;
    static bool available = false;

    if (!checked)
    {
        checked = true;

        TransientContextLock contextLock;

        // Make sure that extensions are initialized
        sf::priv::ensureExtensionsInit();

        available = GLEXT_vertex_buffer_object;
    }

    return available;
}